

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

GLFWglproc glfwGetProcAddress(char *procname)

{
  void *pvVar1;
  _GLFWwindow *window;
  char *procname_local;
  
  if (procname != (char *)0x0) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      procname_local = (char *)0x0;
    }
    else {
      pvVar1 = _glfwPlatformGetTls(&_glfw.contextSlot);
      if (pvVar1 == (void *)0x0) {
        _glfwInputError(0x10002,
                        "Cannot query entry point without a current OpenGL or OpenGL ES context");
        procname_local = (char *)0x0;
      }
      else {
        procname_local = (char *)(**(code **)((long)pvVar1 + 0x260))(procname);
      }
    }
    return (GLFWglproc)procname_local;
  }
  __assert_fail("procname != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/pranjalpokharel7[P]our-rocket/GLFW/src/context.c"
                ,0x2ea,"GLFWglproc glfwGetProcAddress(const char *)");
}

Assistant:

GLFWAPI GLFWglproc glfwGetProcAddress(const char* procname)
{
    _GLFWwindow* window;
    assert(procname != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    window = _glfwPlatformGetTls(&_glfw.contextSlot);
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT,
                        "Cannot query entry point without a current OpenGL or OpenGL ES context");
        return NULL;
    }

    return window->context.getProcAddress(procname);
}